

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

ostream * pstore::operator<<(ostream *stream,variant_type variant)

{
  ostream *poVar1;
  char *local_20;
  char *str;
  variant_type variant_local;
  ostream *stream_local;
  
  local_20 = "";
  switch(variant) {
  case ncs:
    local_20 = "ncs";
    break;
  case rfc_4122:
    local_20 = "rfc_4122";
    break;
  case microsoft:
    local_20 = "microsoft";
    break;
  case future:
    local_20 = "future";
  }
  poVar1 = std::operator<<(stream,local_20);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid::variant_type const variant) {
        char const * str = "";
        switch (variant) {
        case uuid::variant_type::ncs: str = "ncs"; break;
        case uuid::variant_type::rfc_4122: str = "rfc_4122"; break;
        case uuid::variant_type::microsoft: str = "microsoft"; break;
        case uuid::variant_type::future: str = "future"; break; // future definition
        }
        return stream << str;
    }